

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::Path::validatePart(Path *this,StringPtr part)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  bool local_81;
  Fault local_80;
  Fault f_2;
  Fault local_68;
  Fault f_1;
  Fault local_50;
  Fault f;
  StringPtr local_38;
  StringPtr local_28;
  undefined1 local_18 [8];
  StringPtr part_local;
  
  part_local.content.ptr = part.content.ptr;
  local_18 = (undefined1  [8])this;
  StringPtr::StringPtr(&local_28,"");
  bVar1 = StringPtr::operator!=((StringPtr *)local_18,&local_28);
  local_81 = false;
  if (bVar1) {
    StringPtr::StringPtr(&local_38,".");
    bVar1 = StringPtr::operator!=((StringPtr *)local_18,&local_38);
    local_81 = false;
    if (bVar1) {
      StringPtr::StringPtr((StringPtr *)&f,"..");
      local_81 = StringPtr::operator!=((StringPtr *)local_18,(StringPtr *)&f);
    }
  }
  if (local_81 == false) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],kj::StringPtr&>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x12f,FAILED,"part != \"\" && part != \".\" && part != \"..\"",
               "\"invalid path component\", part",(char (*) [23])"invalid path component",
               (StringPtr *)local_18);
    _::Debug::Fault::fatal(&local_50);
  }
  __s = StringPtr::begin((StringPtr *)local_18);
  sVar2 = strlen(__s);
  sVar3 = StringPtr::size((StringPtr *)local_18);
  if (sVar2 != sVar3) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::StringPtr&>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x130,FAILED,"strlen(part.begin()) == part.size()",
               "\"NUL character in path component\", part",
               (char (*) [32])"NUL character in path component",(StringPtr *)local_18);
    _::Debug::Fault::fatal(&local_68);
  }
  StringPtr::findFirst((StringPtr *)&f_2,(char)local_18);
  bVar1 = Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)&f_2,(void *)0x0);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&f_2);
  if (bVar1) {
    return;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68],kj::StringPtr&>
            (&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x132,FAILED,"part.findFirst(\'/\') == nullptr",
             "\"\'/\' character in path component; did you mean to use Path::parse()?\", part",
             (char (*) [68])"\'/\' character in path component; did you mean to use Path::parse()?",
             (StringPtr *)local_18);
  _::Debug::Fault::fatal(&local_80);
}

Assistant:

void Path::validatePart(StringPtr part) {
  KJ_REQUIRE(part != "" && part != "." && part != "..", "invalid path component", part);
  KJ_REQUIRE(strlen(part.begin()) == part.size(), "NUL character in path component", part);
  KJ_REQUIRE(part.findFirst('/') == nullptr,
      "'/' character in path component; did you mean to use Path::parse()?", part);
}